

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O3

void amrex::EB_set_covered_faces
               (Array<MultiFab_*,_3> *umac,int scomp,int ncomp,
               Vector<double,_std::allocator<double>_> *a_vals)

{
  double dVar1;
  pointer __src;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  pointer pdVar4;
  Array<MultiFab_*,_3> *pAVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  size_t __n;
  ulong uVar10;
  long lVar11;
  size_type a_capacity;
  uint uVar12;
  long lVar13;
  int i;
  long lVar14;
  long lVar15;
  int iVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  DeviceVector<Real> vals_dv;
  MFIter mfi;
  long local_300;
  long local_2e8;
  Box local_2ac;
  Box local_290;
  Box local_274;
  PODVector<double,_std::allocator<double>_> local_258;
  Array<MultiFab_*,_3> *local_238;
  Array4<double> local_230;
  FabArray<amrex::EBCellFlagFab> *local_1f0;
  Array4<double> local_1e8;
  Array4<double> local_1a8;
  MultiCutFab *local_168;
  MultiCutFab *local_160;
  MultiCutFab *local_158;
  MFIter local_150;
  Array4<const_double> local_f0;
  Array4<const_double> local_b0;
  Array4<const_double> local_70;
  
  local_238 = umac;
  lVar6 = __dynamic_cast((umac->_M_elems[0]->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                         &EBFArrayBoxFactory::typeinfo,0);
  if (lVar6 != 0) {
    EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar6 + 0xd8));
    local_1f0 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar6 + 0xd8));
    uVar10 = (long)(a_vals->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(a_vals->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    local_258.m_data = (pointer)0x0;
    local_258.m_size = 0;
    local_258.m_capacity = 0;
    a_capacity = 8;
    if (8 < uVar10) {
      do {
        a_capacity = a_capacity * 3 + 1 >> 1;
      } while (a_capacity < uVar10);
    }
    PODVector<double,_std::allocator<double>_>::AllocateBuffer(&local_258,a_capacity);
    __src = (a_vals->super_vector<double,_std::allocator<double>_>).
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
    __n = (long)(a_vals->super_vector<double,_std::allocator<double>_>).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)__src;
    local_258.m_size = uVar10;
    if (__n != 0) {
      memcpy(local_258.m_data,__src,__n);
    }
    pdVar4 = local_258.m_data;
    MFIter::MFIter(&local_150,(FabArrayBase *)local_238->_M_elems[0],true);
    if (local_150.currentIndex < local_150.endIndex) {
      lVar9 = (long)scomp;
      lVar7 = (long)(ncomp + scomp);
      lVar6 = lVar9 * 8;
      do {
        local_230.p = (double *)0x1;
        local_230.jstride._0_4_ = 0;
        MFIter::tilebox(&local_274,&local_150,(IntVect *)&local_230);
        local_230.p = (double *)0x100000000;
        local_230.jstride._0_4_ = 0;
        MFIter::tilebox(&local_290,&local_150,(IntVect *)&local_230);
        local_230.p = (double *)0x0;
        local_230.jstride._0_4_ = 1;
        MFIter::tilebox(&local_2ac,&local_150,(IntVect *)&local_230);
        pAVar5 = local_238;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_230,&local_238->_M_elems[0]->super_FabArray<amrex::FArrayBox>,&local_150);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_1a8,&pAVar5->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&local_150);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_1e8,&pAVar5->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&local_150);
        auVar3 = _DAT_0065b9b0;
        auVar2 = _DAT_0065b9a0;
        piVar8 = &local_150.currentIndex;
        if (local_150.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar8 = ((local_150.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start + local_150.currentIndex;
        }
        iVar16 = *(int *)&((local_1f0->m_fabs_v).
                           super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[*piVar8]->
                          super_BaseFab<amrex::EBCellFlag>).field_0x44;
        if (iVar16 == 1) {
          MultiCutFab::const_array(&local_70,local_168,&local_150);
          MultiCutFab::const_array(&local_b0,local_160,&local_150);
          MultiCutFab::const_array(&local_f0,local_158,&local_150);
          if (0 < ncomp) {
            lVar11 = lVar9;
            local_2e8 = lVar6;
            do {
              iVar16 = local_274.smallend.vect[2];
              if (local_274.smallend.vect[2] <= local_274.bigend.vect[2]) {
                do {
                  if (local_274.smallend.vect[1] <= local_274.bigend.vect[1]) {
                    lVar14 = (long)local_70.p +
                             ((long)local_274.smallend.vect[1] - (long)local_70.begin.y) *
                             local_70.jstride * 8 +
                             ((long)iVar16 - (long)local_70.begin.z) * local_70.kstride * 8 +
                             (long)local_70.begin.x * -8 + (long)local_274.smallend.vect[0] * 8;
                    lVar13 = (long)local_274.smallend.vect[1];
                    do {
                      if (local_274.smallend.vect[0] <= local_274.bigend.vect[0]) {
                        lVar15 = 0;
                        do {
                          dVar1 = *(double *)(lVar14 + lVar15 * 8);
                          if ((dVar1 == 0.0) && (!NAN(dVar1))) {
                            *(double *)
                             ((long)local_230.p +
                             lVar15 * 8 +
                             local_230.nstride * local_2e8 +
                             ((long)iVar16 - (long)local_230.begin.z) * local_230.kstride * 8 +
                             (lVar13 - local_230.begin.y) *
                             CONCAT44(local_230.jstride._4_4_,(undefined4)local_230.jstride) * 8 +
                             (long)local_230.begin.x * -8 + (long)local_274.smallend.vect[0] * 8) =
                                 pdVar4[lVar11];
                          }
                          lVar15 = lVar15 + 1;
                        } while ((local_274.bigend.vect[0] - local_274.smallend.vect[0]) + 1 !=
                                 (int)lVar15);
                      }
                      lVar13 = lVar13 + 1;
                      lVar14 = lVar14 + local_70.jstride * 8;
                    } while (local_274.bigend.vect[1] + 1 != (int)lVar13);
                  }
                  bVar17 = iVar16 != local_274.bigend.vect[2];
                  iVar16 = iVar16 + 1;
                } while (bVar17);
              }
              lVar11 = lVar11 + 1;
              local_2e8 = local_2e8 + 8;
            } while (lVar11 < lVar7);
            if (0 < ncomp) {
              lVar11 = lVar9;
              local_2e8 = lVar6;
              do {
                iVar16 = local_290.smallend.vect[2];
                if (local_290.smallend.vect[2] <= local_290.bigend.vect[2]) {
                  do {
                    if (local_290.smallend.vect[1] <= local_290.bigend.vect[1]) {
                      lVar14 = (long)local_b0.p +
                               ((long)local_290.smallend.vect[1] - (long)local_b0.begin.y) *
                               local_b0.jstride * 8 +
                               ((long)iVar16 - (long)local_b0.begin.z) * local_b0.kstride * 8 +
                               (long)local_b0.begin.x * -8 + (long)local_290.smallend.vect[0] * 8;
                      lVar13 = (long)local_290.smallend.vect[1];
                      do {
                        if (local_290.smallend.vect[0] <= local_290.bigend.vect[0]) {
                          lVar15 = 0;
                          do {
                            dVar1 = *(double *)(lVar14 + lVar15 * 8);
                            if ((dVar1 == 0.0) && (!NAN(dVar1))) {
                              *(double *)
                               ((long)local_1a8.p +
                               lVar15 * 8 +
                               local_1a8.nstride * local_2e8 +
                               ((long)iVar16 - (long)local_1a8.begin.z) * local_1a8.kstride * 8 +
                               (lVar13 - local_1a8.begin.y) * local_1a8.jstride * 8 +
                               (long)local_1a8.begin.x * -8 + (long)local_290.smallend.vect[0] * 8)
                                   = pdVar4[lVar11];
                            }
                            lVar15 = lVar15 + 1;
                          } while ((local_290.bigend.vect[0] - local_290.smallend.vect[0]) + 1 !=
                                   (int)lVar15);
                        }
                        lVar13 = lVar13 + 1;
                        lVar14 = lVar14 + local_b0.jstride * 8;
                      } while (local_290.bigend.vect[1] + 1 != (int)lVar13);
                    }
                    bVar17 = iVar16 != local_290.bigend.vect[2];
                    iVar16 = iVar16 + 1;
                  } while (bVar17);
                }
                lVar11 = lVar11 + 1;
                local_2e8 = local_2e8 + 8;
              } while (lVar11 < lVar7);
              if (0 < ncomp) {
                lVar11 = lVar9;
                local_2e8 = lVar6;
                do {
                  iVar16 = local_2ac.smallend.vect[2];
                  if (local_2ac.smallend.vect[2] <= local_2ac.bigend.vect[2]) {
                    do {
                      if (local_2ac.smallend.vect[1] <= local_2ac.bigend.vect[1]) {
                        lVar14 = (long)local_f0.p +
                                 ((long)local_2ac.smallend.vect[1] - (long)local_f0.begin.y) *
                                 local_f0.jstride * 8 +
                                 ((long)iVar16 - (long)local_f0.begin.z) * local_f0.kstride * 8 +
                                 (long)local_f0.begin.x * -8 + (long)local_2ac.smallend.vect[0] * 8;
                        lVar13 = (long)local_2ac.smallend.vect[1];
                        do {
                          if (local_2ac.smallend.vect[0] <= local_2ac.bigend.vect[0]) {
                            lVar15 = 0;
                            do {
                              dVar1 = *(double *)(lVar14 + lVar15 * 8);
                              if ((dVar1 == 0.0) && (!NAN(dVar1))) {
                                *(double *)
                                 ((long)local_1e8.p +
                                 lVar15 * 8 +
                                 local_1e8.nstride * local_2e8 +
                                 ((long)iVar16 - (long)local_1e8.begin.z) * local_1e8.kstride * 8 +
                                 (lVar13 - local_1e8.begin.y) * local_1e8.jstride * 8 +
                                 (long)local_1e8.begin.x * -8 + (long)local_2ac.smallend.vect[0] * 8
                                 ) = pdVar4[lVar11];
                              }
                              lVar15 = lVar15 + 1;
                            } while ((local_2ac.bigend.vect[0] - local_2ac.smallend.vect[0]) + 1 !=
                                     (int)lVar15);
                          }
                          lVar13 = lVar13 + 1;
                          lVar14 = lVar14 + local_f0.jstride * 8;
                        } while (local_2ac.bigend.vect[1] + 1 != (int)lVar13);
                      }
                      bVar17 = iVar16 != local_2ac.bigend.vect[2];
                      iVar16 = iVar16 + 1;
                    } while (bVar17);
                  }
                  lVar11 = lVar11 + 1;
                  local_2e8 = local_2e8 + 8;
                } while (lVar11 < lVar7);
              }
            }
          }
        }
        else if ((iVar16 == -1) && (0 < ncomp)) {
          uVar12 = local_274.bigend.vect[0] - local_274.smallend.vect[0];
          auVar21._4_4_ = 0;
          auVar21._0_4_ = uVar12;
          auVar21._8_4_ = uVar12;
          auVar21._12_4_ = 0;
          lVar11 = lVar9;
          local_300 = lVar6;
          do {
            iVar16 = local_274.smallend.vect[2];
            if (local_274.smallend.vect[2] <= local_274.bigend.vect[2]) {
              do {
                if (local_274.smallend.vect[1] <= local_274.bigend.vect[1]) {
                  lVar15 = CONCAT44(local_230.jstride._4_4_,(undefined4)local_230.jstride) * 8;
                  lVar14 = (long)local_230.p +
                           local_230.nstride * local_300 +
                           ((long)local_274.smallend.vect[1] - (long)local_230.begin.y) * lVar15 +
                           ((long)iVar16 - (long)local_230.begin.z) * local_230.kstride * 8 +
                           (long)local_230.begin.x * -8 + (long)local_274.smallend.vect[0] * 8 + 8;
                  lVar13 = (long)local_274.smallend.vect[1];
                  do {
                    if (local_274.smallend.vect[0] <= local_274.bigend.vect[0]) {
                      dVar1 = pdVar4[lVar11];
                      uVar10 = 0;
                      do {
                        auVar19._8_4_ = (int)uVar10;
                        auVar19._0_8_ = uVar10;
                        auVar19._12_4_ = (int)(uVar10 >> 0x20);
                        auVar23 = auVar21 ^ auVar3;
                        auVar19 = (auVar19 | auVar2) ^ auVar3;
                        if ((bool)(~(auVar19._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar19._0_4_
                                    || auVar23._4_4_ < auVar19._4_4_) & 1)) {
                          *(double *)(lVar14 + -8 + uVar10 * 8) = dVar1;
                        }
                        if (auVar19._12_4_ <= auVar23._12_4_ &&
                            (auVar19._12_4_ != auVar23._12_4_ || auVar19._8_4_ <= auVar23._8_4_)) {
                          *(double *)(lVar14 + uVar10 * 8) = dVar1;
                        }
                        uVar10 = uVar10 + 2;
                      } while (((ulong)uVar12 + 2 & 0x1fffffffe) != uVar10);
                    }
                    lVar13 = lVar13 + 1;
                    lVar14 = lVar14 + lVar15;
                  } while (local_274.bigend.vect[1] + 1 != (int)lVar13);
                }
                bVar17 = iVar16 != local_274.bigend.vect[2];
                iVar16 = iVar16 + 1;
              } while (bVar17);
            }
            lVar11 = lVar11 + 1;
            local_300 = local_300 + 8;
          } while (lVar11 < lVar7);
          if (0 < ncomp) {
            uVar12 = local_290.bigend.vect[0] - local_290.smallend.vect[0];
            auVar23._4_4_ = 0;
            auVar23._0_4_ = uVar12;
            auVar23._8_4_ = uVar12;
            auVar23._12_4_ = 0;
            auVar23 = auVar23 ^ auVar3;
            lVar11 = lVar9;
            local_300 = lVar6;
            do {
              iVar16 = local_290.smallend.vect[2];
              if (local_290.smallend.vect[2] <= local_290.bigend.vect[2]) {
                do {
                  if (local_290.smallend.vect[1] <= local_290.bigend.vect[1]) {
                    lVar14 = (long)local_1a8.p +
                             local_1a8.nstride * local_300 +
                             ((long)local_290.smallend.vect[1] - (long)local_1a8.begin.y) *
                             local_1a8.jstride * 8 +
                             ((long)iVar16 - (long)local_1a8.begin.z) * local_1a8.kstride * 8 +
                             (long)local_1a8.begin.x * -8 + (long)local_290.smallend.vect[0] * 8 + 8
                    ;
                    lVar13 = (long)local_290.smallend.vect[1];
                    do {
                      if (local_290.smallend.vect[0] <= local_290.bigend.vect[0]) {
                        dVar1 = pdVar4[lVar11];
                        uVar10 = 0;
                        do {
                          auVar20._8_4_ = (int)uVar10;
                          auVar20._0_8_ = uVar10;
                          auVar20._12_4_ = (int)(uVar10 >> 0x20);
                          auVar21 = (auVar20 | auVar2) ^ auVar3;
                          if ((bool)(~(auVar23._4_4_ < auVar21._4_4_ ||
                                      auVar23._0_4_ < auVar21._0_4_ &&
                                      auVar21._4_4_ == auVar23._4_4_) & 1)) {
                            *(double *)(lVar14 + -8 + uVar10 * 8) = dVar1;
                          }
                          if (auVar21._12_4_ <= auVar23._12_4_ &&
                              (auVar21._8_4_ <= auVar23._8_4_ || auVar21._12_4_ != auVar23._12_4_))
                          {
                            *(double *)(lVar14 + uVar10 * 8) = dVar1;
                          }
                          uVar10 = uVar10 + 2;
                        } while (((ulong)uVar12 + 2 & 0x1fffffffe) != uVar10);
                      }
                      lVar13 = lVar13 + 1;
                      lVar14 = lVar14 + local_1a8.jstride * 8;
                    } while (local_290.bigend.vect[1] + 1 != (int)lVar13);
                  }
                  bVar17 = iVar16 != local_290.bigend.vect[2];
                  iVar16 = iVar16 + 1;
                } while (bVar17);
              }
              lVar11 = lVar11 + 1;
              local_300 = local_300 + 8;
            } while (lVar11 < lVar7);
            if (0 < ncomp) {
              uVar12 = local_2ac.bigend.vect[0] - local_2ac.smallend.vect[0];
              auVar18._4_4_ = 0;
              auVar18._0_4_ = uVar12;
              auVar18._8_4_ = uVar12;
              auVar18._12_4_ = 0;
              auVar18 = auVar18 ^ auVar3;
              lVar11 = lVar9;
              local_300 = lVar6;
              do {
                iVar16 = local_2ac.smallend.vect[2];
                if (local_2ac.smallend.vect[2] <= local_2ac.bigend.vect[2]) {
                  do {
                    if (local_2ac.smallend.vect[1] <= local_2ac.bigend.vect[1]) {
                      lVar14 = (long)local_1e8.p +
                               local_1e8.nstride * local_300 +
                               ((long)local_2ac.smallend.vect[1] - (long)local_1e8.begin.y) *
                               local_1e8.jstride * 8 +
                               ((long)iVar16 - (long)local_1e8.begin.z) * local_1e8.kstride * 8 +
                               (long)local_1e8.begin.x * -8 + (long)local_2ac.smallend.vect[0] * 8 +
                               8;
                      lVar13 = (long)local_2ac.smallend.vect[1];
                      do {
                        if (local_2ac.smallend.vect[0] <= local_2ac.bigend.vect[0]) {
                          dVar1 = pdVar4[lVar11];
                          uVar10 = 0;
                          do {
                            auVar22._8_4_ = (int)uVar10;
                            auVar22._0_8_ = uVar10;
                            auVar22._12_4_ = (int)(uVar10 >> 0x20);
                            auVar21 = (auVar22 | auVar2) ^ auVar3;
                            if ((bool)(~(auVar18._4_4_ < auVar21._4_4_ ||
                                        auVar18._0_4_ < auVar21._0_4_ &&
                                        auVar21._4_4_ == auVar18._4_4_) & 1)) {
                              *(double *)(lVar14 + -8 + uVar10 * 8) = dVar1;
                            }
                            if (auVar21._12_4_ <= auVar18._12_4_ &&
                                (auVar21._8_4_ <= auVar18._8_4_ || auVar21._12_4_ != auVar18._12_4_)
                               ) {
                              *(double *)(lVar14 + uVar10 * 8) = dVar1;
                            }
                            uVar10 = uVar10 + 2;
                          } while (((ulong)uVar12 + 2 & 0x1fffffffe) != uVar10);
                        }
                        lVar13 = lVar13 + 1;
                        lVar14 = lVar14 + local_1e8.jstride * 8;
                      } while (local_2ac.bigend.vect[1] + 1 != (int)lVar13);
                    }
                    bVar17 = iVar16 != local_2ac.bigend.vect[2];
                    iVar16 = iVar16 + 1;
                  } while (bVar17);
                }
                lVar11 = lVar11 + 1;
                local_300 = local_300 + 8;
              } while (lVar11 < lVar7);
            }
          }
        }
        MFIter::operator++(&local_150);
      } while (local_150.currentIndex < local_150.endIndex);
    }
    MFIter::~MFIter(&local_150);
    if (local_258.m_data != (pointer)0x0) {
      operator_delete(local_258.m_data,local_258.m_capacity << 3);
    }
  }
  return;
}

Assistant:

void
EB_set_covered_faces (const Array<MultiFab*,AMREX_SPACEDIM>& umac, const int scomp, const int ncomp, const Vector<Real>& a_vals )
{
    const auto factory = dynamic_cast<EBFArrayBoxFactory const*>(&(umac[0]->Factory()));
    if (factory == nullptr) return;

    const auto& area = factory->getAreaFrac();
    const auto& flags = factory->getMultiEBCellFlagFab();

    AMREX_ASSERT(umac[0]->nComp() >= scomp+ncomp);

    Gpu::DeviceVector<Real> vals_dv(a_vals.size());
    Gpu::copy(Gpu::hostToDevice, a_vals.begin(), a_vals.end(), vals_dv.begin());
    Real const* AMREX_RESTRICT vals = vals_dv.data();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*umac[0],TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        AMREX_D_TERM(const Box& xbx = mfi.tilebox(IntVect::TheDimensionVector(0));,
                     const Box& ybx = mfi.tilebox(IntVect::TheDimensionVector(1));,
                     const Box& zbx = mfi.tilebox(IntVect::TheDimensionVector(2)));
        AMREX_D_TERM(Array4<Real> const& u = umac[0]->array(mfi);,
                     Array4<Real> const& v = umac[1]->array(mfi);,
                     Array4<Real> const& w = umac[2]->array(mfi));

        auto fabtyp = flags[mfi].getType();
        if (fabtyp == FabType::covered)
        {
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
                xbx, txbx,
                {
                    const auto lo = amrex::lbound(txbx);
                    const auto hi = amrex::ubound(txbx);
                    for (int n = scomp; n < scomp+ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            u(i,j,k,n) = vals[n];
                        }}}
                    }
                }
                ,ybx, tybx,
                {
                    const auto lo = amrex::lbound(tybx);
                    const auto hi = amrex::ubound(tybx);
                    for (int n = scomp; n < scomp+ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            v(i,j,k,n) = vals[n];
                        }}}
                    }
                }
                ,zbx, tzbx,
                {
                    const auto lo = amrex::lbound(tzbx);
                    const auto hi = amrex::ubound(tzbx);
                    for (int n = scomp; n < scomp+ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            w(i,j,k,n) = vals[n];
                        }}}
                    }
                }
            );
        }
        else if (fabtyp == FabType::singlevalued)
        {
            AMREX_D_TERM(Array4<Real const> const& ax = area[0]->const_array(mfi);,
                         Array4<Real const> const& ay = area[1]->const_array(mfi);,
                         Array4<Real const> const& az = area[2]->const_array(mfi));
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
                xbx, txbx,
                {
                    const auto lo = amrex::lbound(txbx);
                    const auto hi = amrex::ubound(txbx);
                    for (int n = scomp; n < scomp+ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            if (ax(i,j,k) == 0.0) u(i,j,k,n) = vals[n];
                        }}}
                    }
                }
                ,ybx, tybx,
                {
                    const auto lo = amrex::lbound(tybx);
                    const auto hi = amrex::ubound(tybx);
                    for (int n = scomp; n < scomp+ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            if (ay(i,j,k) == 0.0) v(i,j,k,n) = vals[n];
                        }}}
                    }
                }
                ,zbx, tzbx,
                {
                    const auto lo = amrex::lbound(tzbx);
                    const auto hi = amrex::ubound(tzbx);
                    for (int n = scomp; n < scomp+ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            if (az(i,j,k) == 0.0) w(i,j,k,n) = vals[n];
                        }}}
                    }
                }
            );
        }
    }
}